

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O3

void ourWriteOut(OperationConfig *config,per_transfer *per,CURLcode per_result)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  CURLcode CVar6;
  char *pcVar7;
  void *pvVar8;
  char *pcVar9;
  FILE *pFVar10;
  size_t __n;
  size_t *psVar11;
  bool bVar12;
  ulong __n_00;
  long lVar13;
  char *pcVar14;
  FILE *pFVar15;
  FILE *__stream;
  curl_header *header;
  dynbuf name;
  writeoutvar find;
  long local_260;
  dynbuf local_258;
  char *local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  
  __stream = _stdout;
  pcVar9 = config->writeout;
  if (pcVar9 != (char *)0x0) {
    curlx_dyn_init(&local_258,0x18);
    cVar4 = *pcVar9;
    if (cVar4 != '\0') {
      bVar12 = false;
      do {
        psVar11 = &local_258.toobig;
        lVar13 = 0;
        while (cVar4 == '%') {
          cVar1 = pcVar9[lVar13 + 1];
          if (cVar1 != '{') {
            if (cVar1 == '\0') goto LAB_0011e481;
            if (cVar1 == '%') {
              iVar5 = 0x25;
              goto LAB_0011e441;
            }
            iVar5 = strncmp("header{",pcVar9 + lVar13 + 1,7);
            if (iVar5 == 0) {
              pcVar7 = pcVar9 + lVar13 + 8;
              pcVar14 = strchr(pcVar7,0x7d);
              if (pcVar14 == (char *)0x0) {
                fputs("%header{",__stream);
              }
              else {
                __n = (((long)pcVar14 - (long)pcVar9) - lVar13) - 8;
                if (__n < 0x100) {
                  memcpy(&local_238,pcVar7,__n);
                  *(undefined1 *)((long)psVar11 + ((long)pcVar14 - (long)pcVar9)) = 0;
                  iVar5 = curl_easy_header(per->curl,&local_238,0,1,0xffffffff,&local_260);
                  if (iVar5 == 0) {
                    fputs(*(char **)(local_260 + 8),__stream);
                  }
                }
                pcVar7 = pcVar14 + 1;
              }
            }
            else {
              iVar5 = strncmp("output{",pcVar9 + lVar13 + 1,7);
              if (iVar5 == 0) {
                pcVar7 = pcVar9 + lVar13 + 8;
                if (*pcVar7 == '>') {
                  pcVar14 = "w";
                  if (pcVar9[lVar13 + 9] == '>') {
                    pcVar14 = "a";
                    pcVar7 = pcVar9 + lVar13 + 10;
                  }
                }
                else {
                  pcVar14 = "w";
                }
                pcVar9 = strchr(pcVar7,0x7d);
                if (pcVar9 == (char *)0x0) {
                  fputs("%output{",__stream);
                }
                else {
                  __n_00 = (long)pcVar9 - (long)pcVar7;
                  pFVar15 = __stream;
                  bVar3 = bVar12;
                  if (__n_00 < 0x200) {
                    memcpy(&local_238,pcVar7,__n_00);
                    *(undefined1 *)((long)&local_238 + __n_00) = 0;
                    pFVar10 = fopen64((char *)&local_238,pcVar14);
                    if ((pFVar10 != (FILE *)0x0) && (pFVar15 = pFVar10, bVar3 = true, bVar12)) {
                      fclose(__stream);
                    }
                  }
                  bVar12 = bVar3;
                  pcVar7 = pcVar9 + 1;
                  __stream = pFVar15;
                }
              }
              else {
                fputc(0x25,__stream);
                pcVar7 = pcVar9 + lVar13 + 2;
                fputc((int)pcVar9[lVar13 + 1],__stream);
              }
            }
            bVar3 = false;
            goto LAB_0011e495;
          }
          local_238 = (char *)0x0;
          uStack_230 = 0;
          local_228 = 0;
          pcVar7 = strchr(pcVar9 + lVar13,0x7d);
          if (pcVar7 != (char *)0x0) {
            curlx_dyn_reset(&local_258);
            CVar6 = curlx_dyn_addn(&local_258,pcVar9 + lVar13 + 2,
                                   (size_t)(pcVar7 + (-lVar13 - (long)pcVar9) + -2));
            if (CVar6 == CURLE_OK) {
              local_238 = curlx_dyn_ptr(&local_258);
              pvVar8 = bsearch(&local_238,variables,0x48,0x18,matchvar);
              if (pvVar8 == (void *)0x0) goto LAB_0011e555;
              iVar5 = *(int *)((long)pvVar8 + 8);
              if (iVar5 < 0x2f) {
                if (iVar5 == 0xd) {
                  headerJSON((FILE *)__stream,per);
                }
                else {
                  if (iVar5 != 0x27) {
LAB_0011e862:
                    (**(code **)((long)pvVar8 + 0x10))(__stream,pvVar8,per,per_result,0);
                    bVar3 = false;
                    goto LAB_0011e583;
                  }
                  ourWriteOutJSON((FILE *)__stream,variables,0x48,per,per_result);
                }
                bVar3 = false;
              }
              else {
                bVar3 = per_result == CURLE_OK;
                if (iVar5 != 0x2f) {
                  if (iVar5 == 0x43) {
                    pFVar15 = (FILE *)tool_stderr;
                    if (bVar12) {
                      fclose(__stream);
                      pFVar15 = (FILE *)tool_stderr;
                    }
                  }
                  else {
                    if (iVar5 != 0x44) goto LAB_0011e862;
                    pFVar15 = _stdout;
                    if (bVar12) {
                      fclose(__stream);
                      pFVar15 = _stdout;
                    }
                  }
                  bVar12 = false;
                  __stream = pFVar15;
                  bVar3 = false;
                }
              }
            }
            else {
LAB_0011e555:
              curl_mfprintf(tool_stderr,"curl: unknown --write-out variable: \'%.*s\'\n",
                            (((int)pcVar7 - (int)pcVar9) - (int)lVar13) + -2,pcVar9 + lVar13 + 2);
              bVar3 = false;
            }
LAB_0011e583:
            pcVar7 = pcVar7 + 1;
            goto LAB_0011e495;
          }
          fputs("%{",__stream);
          cVar4 = pcVar9[lVar13 + 2];
          lVar13 = lVar13 + 2;
          psVar11 = (size_t *)((long)psVar11 + -2);
          if (cVar4 == '\0') goto LAB_0011e87d;
        }
        if (cVar4 == '\\') {
          bVar2 = pcVar9[lVar13 + 1];
          if (bVar2 < 0x72) {
            if (bVar2 == 0) {
              iVar5 = 0x5c;
              goto LAB_0011e484;
            }
            if (bVar2 == 0x6e) {
              iVar5 = 10;
            }
            else {
LAB_0011e6f8:
              fputc(0x5c,__stream);
              iVar5 = (int)pcVar9[lVar13 + 1];
            }
          }
          else if (bVar2 == 0x72) {
            iVar5 = 0xd;
          }
          else {
            if (bVar2 != 0x74) goto LAB_0011e6f8;
            iVar5 = 9;
          }
LAB_0011e441:
          fputc(iVar5,__stream);
          lVar13 = lVar13 + 2;
        }
        else {
LAB_0011e481:
          iVar5 = (int)cVar4;
LAB_0011e484:
          fputc(iVar5,__stream);
          lVar13 = lVar13 + 1;
        }
        pcVar7 = pcVar9 + lVar13;
        bVar3 = false;
LAB_0011e495:
        cVar4 = *pcVar7;
      } while ((cVar4 != '\0') && (pcVar9 = pcVar7, !bVar3));
LAB_0011e87d:
      if (bVar12) {
        fclose(__stream);
      }
    }
    curlx_dyn_free(&local_258);
  }
  return;
}

Assistant:

void ourWriteOut(struct OperationConfig *config, struct per_transfer *per,
                 CURLcode per_result)
{
  FILE *stream = stdout;
  const char *writeinfo = config->writeout;
  const char *ptr = writeinfo;
  bool done = FALSE;
  bool fclose_stream = FALSE;
  struct dynbuf name;

  if(!writeinfo)
    return;

  curlx_dyn_init(&name, MAX_WRITEOUT_NAME_LENGTH);
  while(ptr && *ptr && !done) {
    if('%' == *ptr && ptr[1]) {
      if('%' == ptr[1]) {
        /* an escaped %-letter */
        fputc('%', stream);
        ptr += 2;
      }
      else {
        /* this is meant as a variable to output */
        char *end;
        size_t vlen;
        if('{' == ptr[1]) {
          struct writeoutvar *wv = NULL;
          struct writeoutvar find = { 0 };
          end = strchr(ptr, '}');
          ptr += 2; /* pass the % and the { */
          if(!end) {
            fputs("%{", stream);
            continue;
          }
          vlen = end - ptr;

          curlx_dyn_reset(&name);
          if(!curlx_dyn_addn(&name, ptr, vlen)) {
            find.name = curlx_dyn_ptr(&name);
            wv = bsearch(&find,
                         variables, CURL_ARRAYSIZE(variables),
                         sizeof(variables[0]), matchvar);
          }
          if(wv) {
            switch(wv->id) {
            case VAR_ONERROR:
              if(per_result == CURLE_OK)
                /* this is not error so skip the rest */
                done = TRUE;
              break;
            case VAR_STDOUT:
              if(fclose_stream)
                fclose(stream);
              fclose_stream = FALSE;
              stream = stdout;
              break;
            case VAR_STDERR:
              if(fclose_stream)
                fclose(stream);
              fclose_stream = FALSE;
              stream = tool_stderr;
              break;
            case VAR_JSON:
              ourWriteOutJSON(stream, variables,
                              CURL_ARRAYSIZE(variables),
                              per, per_result);
              break;
            case VAR_HEADER_JSON:
              headerJSON(stream, per);
              break;
            default:
              (void)wv->writefunc(stream, wv, per, per_result, false);
              break;
            }
          }
          else {
            fprintf(tool_stderr,
                    "curl: unknown --write-out variable: '%.*s'\n",
                    (int)vlen, ptr);
          }
          ptr = end + 1; /* pass the end */
        }
        else if(!strncmp("header{", &ptr[1], 7)) {
          ptr += 8;
          end = strchr(ptr, '}');
          if(end) {
            char hname[256]; /* holds the longest header field name */
            struct curl_header *header;
            vlen = end - ptr;
            if(vlen < sizeof(hname)) {
              memcpy(hname, ptr, vlen);
              hname[vlen] = 0;
              if(CURLHE_OK == curl_easy_header(per->curl, hname, 0,
                                               CURLH_HEADER, -1, &header))
                fputs(header->value, stream);
            }
            ptr = end + 1;
          }
          else
            fputs("%header{", stream);
        }
        else if(!strncmp("output{", &ptr[1], 7)) {
          bool append = FALSE;
          ptr += 8;
          if((ptr[0] == '>') && (ptr[1] == '>')) {
            append = TRUE;
            ptr += 2;
          }
          end = strchr(ptr, '}');
          if(end) {
            char fname[512]; /* holds the longest filename */
            size_t flen = end - ptr;
            if(flen < sizeof(fname)) {
              FILE *stream2;
              memcpy(fname, ptr, flen);
              fname[flen] = 0;
              stream2 = fopen(fname, append ? FOPEN_APPENDTEXT :
                              FOPEN_WRITETEXT);
              if(stream2) {
                /* only change if the open worked */
                if(fclose_stream)
                  fclose(stream);
                stream = stream2;
                fclose_stream = TRUE;
              }
            }
            ptr = end + 1;
          }
          else
            fputs("%output{", stream);
        }
        else {
          /* illegal syntax, then just output the characters that are used */
          fputc('%', stream);
          fputc(ptr[1], stream);
          ptr += 2;
        }
      }
    }
    else if('\\' == *ptr && ptr[1]) {
      switch(ptr[1]) {
      case 'r':
        fputc('\r', stream);
        break;
      case 'n':
        fputc('\n', stream);
        break;
      case 't':
        fputc('\t', stream);
        break;
      default:
        /* unknown, just output this */
        fputc(*ptr, stream);
        fputc(ptr[1], stream);
        break;
      }
      ptr += 2;
    }
    else {
      fputc(*ptr, stream);
      ptr++;
    }
  }
  if(fclose_stream)
    fclose(stream);
  curlx_dyn_free(&name);
}